

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertAlwaysTest.cpp
# Opt level: O0

void __thiscall
AssertAlwaysTest_assertGeShouldAbort_Test::~AssertAlwaysTest_assertGeShouldAbort_Test
          (AssertAlwaysTest_assertGeShouldAbort_Test *this)

{
  AssertAlwaysTest_assertGeShouldAbort_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(AssertAlwaysTest, assertGeShouldAbort)
{
    ::testing::FLAGS_gtest_death_test_style = "threadsafe";
    std::int32_t a = 1;
    std::int32_t b = 2;
    EXPECT_EXIT(
            CPP_ASSERT_ALWAYS_GE(a, b)
            ,::testing::KilledBySignal(SIGABRT)
            , ".*Assertion failure.*");

}